

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
set_caster<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::load(set_caster<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,handle src,bool convert)

{
  bool bVar1;
  handle src_00;
  template_cast_op_type<std::__cxx11::basic_string<char>_> __x;
  handle entry;
  undefined1 local_a8 [8];
  iterator __end3;
  undefined1 local_80 [8];
  iterator __begin3;
  set *__range3;
  key_conv conv;
  set local_38;
  set s;
  bool convert_local;
  set_caster<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  handle src_local;
  
  s.super_object.super_handle.m_ptr = (object)(object)src.m_ptr;
  bVar1 = isinstance<pybind11::set,_0>(src);
  if (bVar1) {
    conv.value.field_2._8_8_ = src.m_ptr;
    reinterpret_borrow<pybind11::set>((pybind11 *)&local_38,src);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->value);
    type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::type_caster((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                   *)&__range3);
    __begin3._16_8_ = (pybind11 *)&local_38;
    object_api<pybind11::handle>::begin
              ((iterator *)local_80,(object_api<pybind11::handle> *)&local_38);
    object_api<pybind11::handle>::end
              ((iterator *)local_a8,(object_api<pybind11::handle> *)__begin3._16_8_);
    while (bVar1 = pybind11::iterator::operator!=((iterator *)local_80,(iterator *)local_a8), bVar1)
    {
      src_00 = pybind11::iterator::operator*((iterator *)local_80);
      bVar1 = type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              ::load((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                      *)&__range3,src_00,convert);
      if (!bVar1) {
        src_local.m_ptr._7_1_ = 0;
        entry.m_ptr._4_4_ = 1;
        goto LAB_0070b402;
      }
      __x = cast_op<std::__cxx11::string>
                      ((make_caster<std::__cxx11::basic_string<char>_> *)&__range3);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->value,__x);
      pybind11::iterator::operator++((iterator *)local_80);
    }
    entry.m_ptr._4_4_ = 2;
LAB_0070b402:
    pybind11::iterator::~iterator((iterator *)local_a8);
    pybind11::iterator::~iterator((iterator *)local_80);
    if (entry.m_ptr._4_4_ == 2) {
      src_local.m_ptr._7_1_ = 1;
    }
    type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::~type_caster((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                    *)&__range3);
    pybind11::set::~set(&local_38);
  }
  else {
    src_local.m_ptr._7_1_ = 0;
  }
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<pybind11::set>(src))
            return false;
        auto s = reinterpret_borrow<pybind11::set>(src);
        value.clear();
        key_conv conv;
        for (auto entry : s) {
            if (!conv.load(entry, convert))
                return false;
            value.insert(cast_op<Key>(conv));
        }
        return true;
    }